

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O0

bool libtest::unit_test<libtest::a_plus_b>::check<(anonymous_namespace)::ac>(path *input_file_path)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  path local_8b8;
  ansi_sgr local_890;
  undefined8 local_888;
  path local_880;
  ansi_sgr local_858;
  undefined8 local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  ansi_sgr local_828;
  undefined8 local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  ansi_sgr local_7f8;
  undefined8 local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  ansi_sgr local_7c8;
  undefined8 local_7c0;
  string local_7b8 [8];
  string line;
  ifstream sol_file;
  ifstream local_590 [8];
  ifstream gen_file;
  ifstream local_388 [8];
  ifstream in_file;
  path local_180;
  ansi_sgr local_158;
  undefined8 local_150;
  undefined1 local_141;
  undefined1 local_140 [7];
  bool ok;
  undefined1 local_118 [8];
  path generated_out_path;
  bool local_b2;
  anon_class_1_0_00000001 local_b1;
  bool passed;
  usize uStack_b0;
  usize time_ms;
  undefined1 local_80 [8];
  path solution_out_path;
  path *input_file_path_local;
  
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::input_file);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file
                );
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   input_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           input_file);
    }
  }
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::generated_output_file
      == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::generated_output_file);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 generated_output_file);
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   generated_output_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           generated_output_file);
    }
  }
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
      solution_output_file_in == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::solution_output_file_in);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file_in);
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   solution_output_file_in,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           solution_output_file_in);
    }
  }
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::solution_output_file
      == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::solution_output_file);
    if (iVar2 != 0) {
      std::ofstream::ofstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file);
      __cxa_atexit(std::ofstream::~ofstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   solution_output_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           solution_output_file);
    }
  }
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ RUN      ] ");
  std::filesystem::__cxx11::path::filename((path *)&solution_out_path._M_cmpts,input_file_path);
  cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>
            ((ansi_sgr)0x25,(path *)&solution_out_path._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&solution_out_path._M_cmpts);
  std::filesystem::__cxx11::path::path((path *)local_80,input_file_path);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            ((path *)&time_ms,(char (*) [5])".txt",auto_format);
  std::filesystem::__cxx11::path::replace_extension((path *)local_80);
  std::filesystem::__cxx11::path::~path((path *)&time_ms);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)
             check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file,
             input_file_path,_S_in);
  std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)
             check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
             solution_output_file,(path *)local_80,_S_out);
  uStack_b0 = run<libtest::unit_test<libtest::a_plus_b>::check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::_lambda()_1_>
                        (&local_b1);
  std::ifstream::close();
  std::ofstream::close();
  local_b2 = false;
  if (uStack_b0 < 100) {
    std::filesystem::__cxx11::path::path((path *)local_118,input_file_path);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              ((path *)local_140,(char (*) [5])".out",auto_format);
    std::filesystem::__cxx11::path::replace_extension((path *)local_118);
    std::filesystem::__cxx11::path::~path((path *)local_140);
    bVar1 = std::filesystem::exists((path *)local_118);
    if (bVar1) {
      std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file
                 ,input_file_path,_S_in);
      std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 generated_output_file,(path *)local_118,_S_in);
      std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file_in,(path *)local_80,_S_in);
      local_141 = a_plus_b::judge((ifstream *)
                                  check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                  ::input_file,
                                  (ifstream *)
                                  check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                  ::generated_output_file,
                                  (ifstream *)
                                  check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                  ::solution_output_file_in);
      if ((bool)local_141) {
        local_850 = 0x20;
        cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[       AC ] ");
        local_858.m_color = white;
        local_858.m_attr = reset;
        std::filesystem::__cxx11::path::filename(&local_880,input_file_path);
        cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                  (local_858,"% (% ms)\n",&local_880,uStack_b0);
        std::filesystem::__cxx11::path::~path(&local_880);
        local_b2 = true;
      }
      else {
        local_150 = 0x1f;
        cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x1f,"[       WA ] ");
        local_158.m_color = white;
        local_158.m_attr = reset;
        std::filesystem::__cxx11::path::filename(&local_180,input_file_path);
        cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                  (local_158,"% (% ms)\n",&local_180,uStack_b0);
        std::filesystem::__cxx11::path::~path(&local_180);
        std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                  (local_388,input_file_path,_S_in);
        std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                  (local_590,(path *)local_118,_S_in);
        std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                  ((ifstream *)(line.field_2._M_local_buf + 8),(path *)local_80,_S_in);
        std::__cxx11::string::string(local_7b8);
        local_7c0 = 0x25;
        cprintln<libtest::ansi_sgr,char_const*>((ansi_sgr)0x25,"(Input)");
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_388,local_7b8);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (!bVar1) break;
          local_7c8.m_color = white;
          local_7c8.m_attr = reset;
          std::__cxx11::string::string((string *)&local_7e8,local_7b8);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>(local_7c8,&local_7e8);
          std::__cxx11::string::~string((string *)&local_7e8);
        }
        local_7f0 = 0x25;
        cprintln<libtest::ansi_sgr,char_const*>((ansi_sgr)0x25,"(Expected)");
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_590,local_7b8);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (!bVar1) break;
          local_7f8.m_color = white;
          local_7f8.m_attr = reset;
          std::__cxx11::string::string((string *)&local_818,local_7b8);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>(local_7f8,&local_818);
          std::__cxx11::string::~string((string *)&local_818);
        }
        local_820 = 0x25;
        cprintln<libtest::ansi_sgr,char_const*>((ansi_sgr)0x25,"(Output)");
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)(line.field_2._M_local_buf + 8),local_7b8);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (!bVar1) break;
          local_828.m_color = white;
          local_828.m_attr = reset;
          std::__cxx11::string::string((string *)&local_848,local_7b8);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>(local_828,&local_848);
          std::__cxx11::string::~string((string *)&local_848);
        }
        std::__cxx11::string::~string(local_7b8);
        std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
        std::ifstream::~ifstream(local_590);
        std::ifstream::~ifstream(local_388);
      }
      std::ifstream::close();
    }
    else {
      local_888 = 0x20;
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[       OK ] ");
      local_890.m_color = white;
      local_890.m_attr = reset;
      std::filesystem::__cxx11::path::filename(&local_8b8,input_file_path);
      cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                (local_890,"% (% ms)\n",&local_8b8,uStack_b0);
      std::filesystem::__cxx11::path::~path(&local_8b8);
      local_b2 = true;
    }
    std::filesystem::__cxx11::path::~path((path *)local_118);
  }
  else {
    cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x1f,"[      TLE ] ");
    std::filesystem::__cxx11::path::filename((path *)&generated_out_path._M_cmpts,input_file_path);
    cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
              ((ansi_sgr)0x25,"% (% ms)\n",(path *)&generated_out_path._M_cmpts,uStack_b0);
    std::filesystem::__cxx11::path::~path((path *)&generated_out_path._M_cmpts);
  }
  std::ifstream::close();
  std::ifstream::close();
  std::ofstream::close();
  std::filesystem::__cxx11::path::~path((path *)local_80);
  return local_b2;
}

Assistant:

static bool check(const fs::path& input_file_path)
    {
        static std::ifstream input_file, generated_output_file, solution_output_file_in;
        static std::ofstream solution_output_file;
        cprintf(ac_color, "[ RUN      ] "), cprintln(message_color, input_file_path.filename());
        auto solution_out_path = input_file_path;
        solution_out_path.replace_extension(".txt");
        input_file.open(input_file_path), solution_output_file.open(solution_out_path);
        const usize time_ms = run([&]() { Solution::solve(input_file, solution_output_file); });
        input_file.close(), solution_output_file.close();
        bool passed = false;
        if (time_ms >= Problem::time_limit) {
            cprintf(tle_color, "[      TLE ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
        } else {
            auto generated_out_path = input_file_path;
            generated_out_path.replace_extension(".out");
            if (fs::exists(generated_out_path)) {
                input_file.open(input_file_path), generated_output_file.open(generated_out_path), solution_output_file_in.open(solution_out_path);
                const bool ok = Problem::judge(input_file, generated_output_file, solution_output_file_in);
                if (not ok) {
                    cprintf(wa_color, "[       WA ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    std::ifstream in_file{input_file_path}, gen_file{generated_out_path}, sol_file{solution_out_path};
                    std::string line;
                    cprintln(message_color, "(Input)");
                    while (std::getline(in_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Expected)");
                    while (std::getline(gen_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Output)");
                    while (std::getline(sol_file, line)) { cprintln(message_color, line); }
                } else {
                    cprintf(ac_color, "[       AC ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    passed = true;
                }
                solution_output_file_in.close();
            } else {
                cprintf(ac_color, "[       OK ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                passed = true;
            }
        }
        generated_output_file.close(), input_file.close(), solution_output_file.close();
        return passed;
    }